

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  bool bVar1;
  secp256k1_context *psVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  unsigned_long _zzq_result_3;
  size_t outl;
  unsigned_long _zzq_result;
  secp256k1_pubkey *local_1d0;
  size_t local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  int local_1a4;
  size_t local_1a0;
  uchar *local_198;
  int local_190;
  uint local_18c;
  unsigned_long _zzq_args [6];
  secp256k1_pubkey pubkey;
  uchar pubkeyc [65];
  secp256k1_ge ge;
  
  local_1a0 = 3;
  local_1a4 = xvalid;
  local_198 = input;
  local_190 = yvalid;
  do {
    if (local_1a0 == 0x42) {
      return;
    }
    bVar9 = local_1a4 != 0;
    pubkeyc._1_8_ = *(undefined8 *)local_198;
    pubkeyc._9_8_ = *(undefined8 *)(local_198 + 8);
    pubkeyc._17_8_ = *(undefined8 *)(local_198 + 0x10);
    pubkeyc._25_8_ = *(undefined8 *)(local_198 + 0x18);
    pubkeyc._33_8_ = *(undefined8 *)(local_198 + 0x20);
    pubkeyc._41_8_ = *(undefined8 *)(local_198 + 0x28);
    pubkeyc._49_8_ = *(undefined8 *)(local_198 + 0x30);
    pubkeyc._57_8_ = *(undefined8 *)(local_198 + 0x38);
    _zzq_args[0] = 0x4d430001;
    _zzq_args[1] = (unsigned_long)(pubkeyc + local_1a0);
    lVar4 = local_1a0 - 0x41;
    _zzq_args[2] = -lVar4;
    _zzq_args[3] = 0;
    _zzq_args[4] = 0;
    _zzq_args[5] = 0;
    bVar10 = local_1a0 == 0x21;
    local_18c = (uint)(lVar4 == 0) * 4;
    for (uVar7 = 0; uVar7 != 0x100; uVar7 = uVar7 + 1) {
      pubkeyc[0] = (uchar)uVar7;
      uVar8 = local_198[0x3f] & 1 | 2;
      if ((local_1a4 == 0 || local_190 == 0) || (uVar7 & 4) != local_18c) {
        bVar1 = false;
      }
      else {
        bVar1 = ((uVar7 & 0xfb) == uVar8 || uVar7 == 4) && (lVar4 == 0 || bVar10);
      }
      if (!(bool)(((bVar9 && bVar10) && (uVar7 & 0xfe) == 2) | bVar1)) {
        pubkey.data[0x30] = 0xfe;
        pubkey.data[0x31] = 0xfe;
        pubkey.data[0x32] = 0xfe;
        pubkey.data[0x33] = 0xfe;
        pubkey.data[0x34] = 0xfe;
        pubkey.data[0x35] = 0xfe;
        pubkey.data[0x36] = 0xfe;
        pubkey.data[0x37] = 0xfe;
        pubkey.data[0x38] = 0xfe;
        pubkey.data[0x39] = 0xfe;
        pubkey.data[0x3a] = 0xfe;
        pubkey.data[0x3b] = 0xfe;
        pubkey.data[0x3c] = 0xfe;
        pubkey.data[0x3d] = 0xfe;
        pubkey.data[0x3e] = 0xfe;
        pubkey.data[0x3f] = 0xfe;
        pubkey.data[0x20] = 0xfe;
        pubkey.data[0x21] = 0xfe;
        pubkey.data[0x22] = 0xfe;
        pubkey.data[0x23] = 0xfe;
        pubkey.data[0x24] = 0xfe;
        pubkey.data[0x25] = 0xfe;
        pubkey.data[0x26] = 0xfe;
        pubkey.data[0x27] = 0xfe;
        pubkey.data[0x28] = 0xfe;
        pubkey.data[0x29] = 0xfe;
        pubkey.data[0x2a] = 0xfe;
        pubkey.data[0x2b] = 0xfe;
        pubkey.data[0x2c] = 0xfe;
        pubkey.data[0x2d] = 0xfe;
        pubkey.data[0x2e] = 0xfe;
        pubkey.data[0x2f] = 0xfe;
        pubkey.data[0x10] = 0xfe;
        pubkey.data[0x11] = 0xfe;
        pubkey.data[0x12] = 0xfe;
        pubkey.data[0x13] = 0xfe;
        pubkey.data[0x14] = 0xfe;
        pubkey.data[0x15] = 0xfe;
        pubkey.data[0x16] = 0xfe;
        pubkey.data[0x17] = 0xfe;
        pubkey.data[0x18] = 0xfe;
        pubkey.data[0x19] = 0xfe;
        pubkey.data[0x1a] = 0xfe;
        pubkey.data[0x1b] = 0xfe;
        pubkey.data[0x1c] = 0xfe;
        pubkey.data[0x1d] = 0xfe;
        pubkey.data[0x1e] = 0xfe;
        pubkey.data[0x1f] = 0xfe;
        pubkey.data[0] = 0xfe;
        pubkey.data[1] = 0xfe;
        pubkey.data[2] = 0xfe;
        pubkey.data[3] = 0xfe;
        pubkey.data[4] = 0xfe;
        pubkey.data[5] = 0xfe;
        pubkey.data[6] = 0xfe;
        pubkey.data[7] = 0xfe;
        pubkey.data[8] = 0xfe;
        pubkey.data[9] = 0xfe;
        pubkey.data[10] = 0xfe;
        pubkey.data[0xb] = 0xfe;
        pubkey.data[0xc] = 0xfe;
        pubkey.data[0xd] = 0xfe;
        pubkey.data[0xe] = 0xfe;
        pubkey.data[0xf] = 0xfe;
        _zzq_args[0] = 0x4d430001;
        _zzq_args[2] = 0x40;
        _zzq_args[3] = 0;
        _zzq_args[4] = 0;
        _zzq_args[5] = 0;
        _zzq_result = 0;
        _zzq_args[1] = (unsigned_long)&pubkey;
        iVar3 = secp256k1_ec_pubkey_parse(CTX,&pubkey,pubkeyc,local_1a0);
        if (iVar3 != 0) {
          pcVar6 = 
          "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0"
          ;
          uVar5 = 0x166a;
          goto LAB_0013d18c;
        }
        _zzq_args[2] = 0x40;
        _zzq_args[3] = 0;
        _zzq_args[4] = 0;
        _zzq_args[5] = 0;
        _zzq_result = 0;
        _zzq_args[0] = (unsigned_long)(CTX->illegal_callback).fn;
        _zzq_args[1] = (unsigned_long)(CTX->illegal_callback).data;
        secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&_zzq_result);
        iVar3 = secp256k1_pubkey_load(CTX,&ge,&pubkey);
        psVar2 = CTX;
        if (iVar3 == 0) {
          (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)_zzq_args[0];
          (psVar2->illegal_callback).data = (void *)_zzq_args[1];
          if ((int)_zzq_result == 1) goto LAB_0013cf42;
          pcVar6 = "test condition failed: _calls_to_callback == 1";
        }
        else {
          pcVar6 = "test condition failed: (secp256k1_pubkey_load(CTX, &ge, &pubkey)) == 0";
        }
        uVar5 = 0x166c;
LAB_0013d18c:
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
                ,uVar5,pcVar6);
        abort();
      }
      pubkey.data[0] = '\0';
      pubkey.data[1] = '\0';
      pubkey.data[2] = '\0';
      pubkey.data[3] = '\0';
      pubkey.data[4] = '\0';
      pubkey.data[5] = '\0';
      pubkey.data[6] = '\0';
      pubkey.data[7] = '\0';
      pubkey.data[8] = '\0';
      pubkey.data[9] = '\0';
      pubkey.data[10] = '\0';
      pubkey.data[0xb] = '\0';
      pubkey.data[0xc] = '\0';
      pubkey.data[0xd] = '\0';
      pubkey.data[0xe] = '\0';
      pubkey.data[0xf] = '\0';
      pubkey.data[0x10] = '\0';
      pubkey.data[0x11] = '\0';
      pubkey.data[0x12] = '\0';
      pubkey.data[0x13] = '\0';
      pubkey.data[0x14] = '\0';
      pubkey.data[0x15] = '\0';
      pubkey.data[0x16] = '\0';
      pubkey.data[0x17] = '\0';
      pubkey.data[0x18] = '\0';
      pubkey.data[0x19] = '\0';
      pubkey.data[0x1a] = '\0';
      pubkey.data[0x1b] = '\0';
      pubkey.data[0x1c] = '\0';
      pubkey.data[0x1d] = '\0';
      pubkey.data[0x1e] = '\0';
      pubkey.data[0x1f] = '\0';
      pubkey.data[0x20] = '\0';
      pubkey.data[0x21] = '\0';
      pubkey.data[0x22] = '\0';
      pubkey.data[0x23] = '\0';
      pubkey.data[0x24] = '\0';
      pubkey.data[0x25] = '\0';
      pubkey.data[0x26] = '\0';
      pubkey.data[0x27] = '\0';
      pubkey.data[0x28] = '\0';
      pubkey.data[0x29] = '\0';
      pubkey.data[0x2a] = '\0';
      pubkey.data[0x2b] = '\0';
      pubkey.data[0x2c] = '\0';
      pubkey.data[0x2d] = '\0';
      pubkey.data[0x2e] = '\0';
      pubkey.data[0x2f] = '\0';
      pubkey.data[0x30] = '\0';
      pubkey.data[0x31] = '\0';
      pubkey.data[0x32] = '\0';
      pubkey.data[0x33] = '\0';
      pubkey.data[0x34] = '\0';
      pubkey.data[0x35] = '\0';
      pubkey.data[0x36] = '\0';
      pubkey.data[0x37] = '\0';
      pubkey.data[0x38] = '\0';
      pubkey.data[0x39] = '\0';
      pubkey.data[0x3a] = '\0';
      pubkey.data[0x3b] = '\0';
      pubkey.data[0x3c] = '\0';
      pubkey.data[0x3d] = '\0';
      pubkey.data[0x3e] = '\0';
      pubkey.data[0x3f] = '\0';
      _zzq_result = 0x4d430001;
      local_1c8 = 0x40;
      local_1c0 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      outl = 0;
      local_1d0 = &pubkey;
      iVar3 = secp256k1_ec_pubkey_parse(CTX,&pubkey,pubkeyc,local_1a0);
      if (iVar3 == 0) {
        pcVar6 = 
        "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1";
        uVar5 = 0x164d;
        goto LAB_0013d18c;
      }
      outl = 0x41;
      _zzq_result = 0x4d430001;
      local_1c8 = 0x41;
      local_1c0 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      local_1d0 = (secp256k1_pubkey *)_zzq_args;
      iVar3 = secp256k1_ec_pubkey_serialize(CTX,(uchar *)_zzq_args,&outl,&pubkey,0x102);
      if (iVar3 == 0) {
        pcVar6 = 
        "test condition failed: secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1"
        ;
        uVar5 = 0x1651;
        goto LAB_0013d18c;
      }
      _zzq_result = 0x4d430005;
      local_1c8 = outl;
      local_1c0 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      if (outl != 0x21) {
        pcVar6 = "test condition failed: outl == 33";
        uVar5 = 0x1653;
        local_1d0 = (secp256k1_pubkey *)_zzq_args;
        goto LAB_0013d18c;
      }
      local_1d0 = (secp256k1_pubkey *)_zzq_args;
      iVar3 = secp256k1_memcmp_var((void *)((long)_zzq_args + 1),pubkeyc + 1,0x20);
      if (iVar3 != 0) {
        pcVar6 = "test condition failed: secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0";
        uVar5 = 0x1654;
        goto LAB_0013d18c;
      }
      if ((local_1a0 == 0x21) && ((uchar)_zzq_args[0] != pubkeyc[0])) {
        pcVar6 = "test condition failed: (pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0])";
        uVar5 = 0x1655;
        goto LAB_0013d18c;
      }
      if (bVar1) {
        if ((uchar)_zzq_args[0] != (uchar)uVar8) {
          pcVar6 = "test condition failed: pubkeyo[0] == ysign";
          uVar5 = 0x1658;
          goto LAB_0013d18c;
        }
        iVar3 = secp256k1_pubkey_load(CTX,&ge,&pubkey);
        if (iVar3 == 0) {
          pcVar6 = "test condition failed: secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1";
          uVar5 = 0x1659;
          goto LAB_0013d18c;
        }
        pubkey.data[0x30] = '\0';
        pubkey.data[0x31] = '\0';
        pubkey.data[0x32] = '\0';
        pubkey.data[0x33] = '\0';
        pubkey.data[0x34] = '\0';
        pubkey.data[0x35] = '\0';
        pubkey.data[0x36] = '\0';
        pubkey.data[0x37] = '\0';
        pubkey.data[0x38] = '\0';
        pubkey.data[0x39] = '\0';
        pubkey.data[0x3a] = '\0';
        pubkey.data[0x3b] = '\0';
        pubkey.data[0x3c] = '\0';
        pubkey.data[0x3d] = '\0';
        pubkey.data[0x3e] = '\0';
        pubkey.data[0x3f] = '\0';
        pubkey.data[0x20] = '\0';
        pubkey.data[0x21] = '\0';
        pubkey.data[0x22] = '\0';
        pubkey.data[0x23] = '\0';
        pubkey.data[0x24] = '\0';
        pubkey.data[0x25] = '\0';
        pubkey.data[0x26] = '\0';
        pubkey.data[0x27] = '\0';
        pubkey.data[0x28] = '\0';
        pubkey.data[0x29] = '\0';
        pubkey.data[0x2a] = '\0';
        pubkey.data[0x2b] = '\0';
        pubkey.data[0x2c] = '\0';
        pubkey.data[0x2d] = '\0';
        pubkey.data[0x2e] = '\0';
        pubkey.data[0x2f] = '\0';
        pubkey.data[0x10] = '\0';
        pubkey.data[0x11] = '\0';
        pubkey.data[0x12] = '\0';
        pubkey.data[0x13] = '\0';
        pubkey.data[0x14] = '\0';
        pubkey.data[0x15] = '\0';
        pubkey.data[0x16] = '\0';
        pubkey.data[0x17] = '\0';
        pubkey.data[0x18] = '\0';
        pubkey.data[0x19] = '\0';
        pubkey.data[0x1a] = '\0';
        pubkey.data[0x1b] = '\0';
        pubkey.data[0x1c] = '\0';
        pubkey.data[0x1d] = '\0';
        pubkey.data[0x1e] = '\0';
        pubkey.data[0x1f] = '\0';
        pubkey.data[0] = '\0';
        pubkey.data[1] = '\0';
        pubkey.data[2] = '\0';
        pubkey.data[3] = '\0';
        pubkey.data[4] = '\0';
        pubkey.data[5] = '\0';
        pubkey.data[6] = '\0';
        pubkey.data[7] = '\0';
        pubkey.data[8] = '\0';
        pubkey.data[9] = '\0';
        pubkey.data[10] = '\0';
        pubkey.data[0xb] = '\0';
        pubkey.data[0xc] = '\0';
        pubkey.data[0xd] = '\0';
        pubkey.data[0xe] = '\0';
        pubkey.data[0xf] = '\0';
        _zzq_result = 0x4d430001;
        local_1c8 = 0x40;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        local_1d0 = &pubkey;
        secp256k1_ge_to_bytes(pubkey.data,&ge);
        outl = 0x41;
        _zzq_result = 0x4d430001;
        local_1c8 = 0x41;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        local_1d0 = (secp256k1_pubkey *)_zzq_args;
        iVar3 = secp256k1_ec_pubkey_serialize(CTX,(uchar *)_zzq_args,&outl,&pubkey,2);
        if (iVar3 == 0) {
          pcVar6 = 
          "test condition failed: secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1"
          ;
          uVar5 = 0x1660;
          goto LAB_0013d18c;
        }
        _zzq_result = 0x4d430005;
        local_1c8 = outl;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        if (outl != 0x41) {
          pcVar6 = "test condition failed: outl == 65";
          uVar5 = 0x1662;
          local_1d0 = (secp256k1_pubkey *)_zzq_args;
          goto LAB_0013d18c;
        }
        if ((uchar)_zzq_args[0] != '\x04') {
          pcVar6 = "test condition failed: pubkeyo[0] == 4";
          uVar5 = 0x1663;
          local_1d0 = (secp256k1_pubkey *)_zzq_args;
          goto LAB_0013d18c;
        }
        local_1d0 = (secp256k1_pubkey *)_zzq_args;
        iVar3 = secp256k1_memcmp_var((void *)((long)_zzq_args + 1),local_198,0x40);
        if (iVar3 != 0) {
          pcVar6 = "test condition failed: secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0";
          uVar5 = 0x1664;
          goto LAB_0013d18c;
        }
      }
LAB_0013cf42:
    }
    local_1a0 = local_1a0 + 1;
  } while( true );
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}